

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.cpp
# Opt level: O2

char * pstore::utf::index(char *__s,int __c)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  undefined4 in_register_00000034;
  
  if (__s != (char *)0x0) {
    sVar1 = strlen(__s);
    pcVar2 = index<char_const*>(__s,__s + sVar1,CONCAT44(in_register_00000034,__c));
    pcVar3 = (char *)0x0;
    if (pcVar2 != __s + sVar1) {
      pcVar3 = pcVar2;
    }
    return pcVar3;
  }
  return (char *)0x0;
}

Assistant:

auto index (gsl::czstring const str, std::size_t const pos) -> gsl::czstring {
            if (str == nullptr) {
                return nullptr;
            }
            gsl::czstring const end = str + std::strlen (str);
            gsl::czstring const result = index (str, end, pos);
            return result == end ? nullptr : result;
        }